

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char buf [64];
  int iVar16;
  int local_8c;
  ImVec2 local_88;
  ImGuiContext *local_80;
  ImVec2 local_78 [9];
  
  if (((flags & 0x700000U) == 0 || (flags & 0x1800000U) == 0) &&
     (bVar8 = BeginPopup("context",0), bVar8)) {
    local_80 = GImGui;
    uVar10 = GImGui->ColorEditOptions;
    if ((flags & 0x700000U) == 0) {
      bVar8 = RadioButton("RGB",(bool)((byte)(uVar10 >> 0x14) & 1));
      uVar9 = (uVar10 & 0xff8fffff) + 0x100000;
      if (!bVar8) {
        uVar9 = uVar10;
      }
      bVar8 = RadioButton("HSV",(bool)((byte)(uVar9 >> 0x15) & 1));
      uVar10 = uVar10 & 0xff8fffff | 0x200000;
      if (!bVar8) {
        uVar10 = uVar9;
      }
      bVar8 = RadioButton("Hex",(bool)((byte)(uVar10 >> 0x16) & 1));
      if (bVar8) {
        uVar10 = uVar10 & 0xff8fffff | 0x400000;
      }
    }
    if ((flags & 0x1800000U) == 0) {
      if (((flags & 0x700000U) == 0) && (GImGui->CurrentWindow->SkipItems == false)) {
        SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
      }
      bVar8 = RadioButton("0..255",(bool)((byte)(uVar10 >> 0x17) & 1));
      uVar9 = (uVar10 & 0xfe7fffff) + 0x800000;
      if (!bVar8) {
        uVar9 = uVar10;
      }
      bVar8 = RadioButton("0.00..1.00",(bool)((byte)(uVar9 >> 0x18) & 1));
      uVar10 = uVar10 & 0xfe7fffff | 0x1000000;
      if (!bVar8) {
        uVar10 = uVar9;
      }
    }
    if (GImGui->CurrentWindow->SkipItems == false) {
      SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
    }
    local_78[0] = (ImVec2)vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
    bVar8 = ButtonEx("Copy as..",local_78,0);
    if (bVar8) {
      OpenPopup("Copy",0);
    }
    bVar8 = BeginPopup("Copy",0);
    if (bVar8) {
      fVar1 = *col;
      fVar2 = col[1];
      auVar14 = SUB6416(ZEXT464(0x3f800000),0);
      auVar5 = vminss_avx(auVar14,ZEXT416((uint)fVar1));
      auVar15 = ZEXT816(0) << 0x40;
      auVar4 = vcmpss_avx(ZEXT416((uint)fVar1),auVar15,1);
      auVar4 = vandnps_avx(auVar4,auVar5);
      auVar6 = vminss_avx(auVar14,ZEXT416((uint)fVar2));
      auVar5 = vcmpss_avx(ZEXT416((uint)fVar2),auVar15,1);
      auVar5 = vandnps_avx(auVar5,auVar6);
      fVar3 = col[2];
      auVar7 = vminss_avx(auVar14,ZEXT416((uint)fVar3));
      auVar6 = vcmpss_avx(ZEXT416((uint)fVar3),auVar15,1);
      auVar6 = vandnps_avx(auVar6,auVar7);
      local_8c = 0xff;
      if ((flags & 2U) == 0) {
        auVar14 = vminss_avx(auVar14,ZEXT416((uint)col[3]));
        auVar7 = vcmpss_avx(ZEXT416((uint)col[3]),auVar15,1);
        auVar7 = vandnps_avx(auVar7,auVar14);
        local_8c = (int)(auVar7._0_4_ * 255.0 + 0.5);
      }
      if ((flags & 2U) == 0) {
        dVar13 = (double)col[3];
      }
      else {
        dVar13 = 1.0;
      }
      uVar9 = (uint)(auVar4._0_4_ * 255.0 + 0.5);
      uVar11 = (uint)(auVar5._0_4_ * 255.0 + 0.5);
      uVar12 = (uint)(auVar6._0_4_ * 255.0 + 0.5);
      ImFormatString((char *)local_78,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)",(double)fVar1,
                     (double)fVar2,(double)fVar3,dVar13);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar8 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar8) {
        SetClipboardText((char *)local_78);
      }
      iVar16 = local_8c;
      ImFormatString((char *)local_78,0x40,"(%d,%d,%d,%d)",(ulong)uVar9,(ulong)uVar11,(ulong)uVar12,
                     local_8c);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar8 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar8) {
        SetClipboardText((char *)local_78);
      }
      ImFormatString((char *)local_78,0x40,"#%02X%02X%02X",(ulong)uVar9,(ulong)uVar11,(ulong)uVar12,
                     iVar16);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar8 = Selectable((char *)local_78,false,0,&local_88);
      if (bVar8) {
        SetClipboardText((char *)local_78);
      }
      if ((flags & 2U) == 0) {
        ImFormatString((char *)local_78,0x40,"#%02X%02X%02X%02X",(ulong)uVar9,(ulong)uVar11,
                       (ulong)uVar12,local_8c);
        local_88.x = 0.0;
        local_88.y = 0.0;
        bVar8 = Selectable((char *)local_78,false,0,&local_88);
        if (bVar8) {
          SetClipboardText((char *)local_78);
        }
      }
      EndPopup();
    }
    local_80->ColorEditOptions = uVar10;
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags__DisplayMask);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags__DataTypeMask);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags__DisplayMask) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1, 0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}